

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_Test3DTileXResource_Test::TestBody
          (CTestGen9Resource_Test3DTileXResource_Test *this)

{
  GMM_RESOURCE_FORMAT GVar1;
  uint32_t uVar2;
  GMM_RESOURCE_INFO *pGVar3;
  uint32_t i_1;
  uint32_t i;
  TEST_BPP TVar4;
  undefined8 uStack_b8;
  GMM_RESCREATE_PARAMS gmmParams;
  
  gmmParams.pExistingSysMem = 0;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.BaseHeight = 0;
  gmmParams.Depth = 0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.CpTag = 0;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  uStack_b8 = 3;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x800000000;
  gmmParams.Type = RESOURCE_INVALID;
  gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
  for (TVar4 = TEST_BPP_8; TVar4 != TEST_BPP_MAX; TVar4 = TVar4 + TEST_BPP_16) {
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)this,TVar4);
    uStack_b8 = CONCAT44(GVar1,(undefined4)uStack_b8);
    gmmParams.CpTag = 1;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth64 = 0x100000001;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&uStack_b8);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,0x200);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x1000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar3,8);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
  }
  for (TVar4 = TEST_BPP_8; TVar4 != TEST_BPP_MAX; TVar4 = TVar4 + TEST_BPP_16) {
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)this,TVar4);
    uStack_b8 = CONCAT44(GVar1,(undefined4)uStack_b8);
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,TVar4);
    gmmParams._40_8_ = ZEXT48((int)(0x200 / (ulong)uVar2) + 1);
    gmmParams.field_6.BaseWidth64 = 0x100000001;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&uStack_b8,0x200 % (ulong)uVar2);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,0x400);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x2000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar3,8);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
  }
  for (TVar4 = TEST_BPP_8; TVar4 != TEST_BPP_MAX; TVar4 = TVar4 + TEST_BPP_16) {
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)this,TVar4);
    uStack_b8 = CONCAT44(GVar1,(undefined4)uStack_b8);
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,TVar4);
    gmmParams._40_8_ = ZEXT48((int)(0x200 / (ulong)uVar2) + 1);
    gmmParams.field_6.BaseWidth64 = 0x100000009;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&uStack_b8,0x200 % (ulong)uVar2);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,0x400);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x4000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar3,0x10);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
  }
  for (TVar4 = TEST_BPP_8; TVar4 != TEST_BPP_MAX; TVar4 = TVar4 + TEST_BPP_16) {
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)this,TVar4);
    uStack_b8 = CONCAT44(GVar1,(undefined4)uStack_b8);
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,TVar4);
    gmmParams._40_8_ = ZEXT48((int)(0x200 / (ulong)uVar2) + 1);
    gmmParams.field_6.BaseWidth64 = 0x200000009;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&uStack_b8,0x200 % (ulong)uVar2);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,0x400);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x8000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar3,0x10);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test3DTileXResource)
{
    // Horizontal/Vertical pixel alignment
    const uint32_t HAlign                    = 16;
    const uint32_t VAlign                    = 4;
    const uint32_t TileSize[TEST_BPP_MAX][3] = {{512, 8, 1},
                                                {512, 8, 1},
                                                {512, 8, 1},
                                                {512, 8, 1},
                                                {512, 8, 1}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_3D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledX    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, 2 * TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);
        VerifyResourceSize<true>(ResourceInfo, 2 * GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1;
        gmmParams.BaseHeight  = TileSize[i][1] + 1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, 2 * TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);
        VerifyResourceSize<true>(ResourceInfo, 2 * 2 * GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, 2 * TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y/Z dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1;
        gmmParams.BaseHeight  = TileSize[i][1] + 1;
        gmmParams.Depth       = TileSize[i][2] + 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, 2 * TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);
        VerifyResourceSize<true>(ResourceInfo, 2 * 2 * 2 * GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, 2 * TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}